

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_eval_simd.h
# Opt level: O2

void __thiscall
embree::sse2::
PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
::PatchEvalSimd(PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
                *this,CacheEntry *entry,size_t commitCounter,HalfEdge *edge,char *vertices,
               size_t stride,vboolf_impl<4> *valid0,vfloat_impl<4> *u,vfloat_impl<4> *v,float *P,
               float *dPdu,float *dPdv,float *ddPdudu,float *ddPdvdv,float *ddPdudv,size_t dstride,
               size_t N)

{
  SpinLock *this_00;
  long lVar1;
  undefined1 auVar2 [16];
  long lVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  long *plVar7;
  Ref u_00;
  ThreadWorkState *t_state;
  long lVar8;
  ulong uVar9;
  vboolf_impl<4> valid2;
  vboolf_impl<4> valid1;
  size_t stride_local;
  char *vertices_local;
  HalfEdge *edge_local;
  FeatureAdaptiveEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
  local_70;
  
  valid1.field_0._0_8_ = &edge_local;
  valid1.field_0._8_8_ = &vertices_local;
  this->P = P;
  this->dPdu = dPdu;
  this->dPdv = dPdv;
  this->ddPdudu = ddPdudu;
  this->ddPdvdv = ddPdvdv;
  this->ddPdudv = ddPdudv;
  this->dstride = dstride;
  this->N = N;
  lVar3 = DAT_0220a4c0;
  vertices_local = vertices;
  edge_local = edge;
  plVar6 = (long *)__tls_get_addr(&PTR_021f8148);
  t_state = (ThreadWorkState *)*plVar6;
  if (t_state == (ThreadWorkState *)0x0) {
    SharedLazyTessellationCache::getNextRenderThreadWorkState
              ((SharedLazyTessellationCache *)
               &SharedLazyTessellationCache::sharedLazyTessellationCache);
    t_state = (ThreadWorkState *)*plVar6;
  }
  lVar8 = commitCounter * 8;
  this_00 = &entry->mutex;
  do {
    while( true ) {
      LOCK();
      uVar9 = (t_state->counter).super___atomic_base<unsigned_long>._M_i;
      (t_state->counter).super___atomic_base<unsigned_long>._M_i =
           (t_state->counter).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      if (uVar9 < 4) break;
      LOCK();
      (t_state->counter).super___atomic_base<unsigned_long>._M_i =
           (t_state->counter).super___atomic_base<unsigned_long>._M_i - 1;
      UNLOCK();
      SharedLazyTessellationCache::waitForUsersLessEqual
                ((SharedLazyTessellationCache *)
                 &SharedLazyTessellationCache::sharedLazyTessellationCache,t_state,0);
    }
    uVar9 = (entry->tag).data.super_atomic<long>.super___atomic_base<long>._M_i;
    if (uVar9 != 0) {
      u_00.ptr = (uVar9 & 0xffffffffff) + SharedLazyTessellationCache::sharedLazyTessellationCache;
      if ((vfloat_impl<4> *)u_00.ptr != (vfloat_impl<4> *)0x0 &&
          (ulong)(DAT_0220a4c0 + lVar8) <= ((long)uVar9 >> 0x28) + 7U) goto LAB_005cac9b;
    }
    valid2.field_0.i[0] = valid2.field_0.i[0] & 0xffffff00;
    if (((this_00->flag).super_atomic<bool>._M_base._M_i & 1U) == 0) {
      bVar4 = std::atomic<bool>::compare_exchange_strong
                        ((atomic<bool> *)this_00,(bool *)&valid2,true,memory_order_acquire);
      if (bVar4) {
        lVar1 = (entry->tag).data.super_atomic<long>.super___atomic_base<long>._M_i;
        if ((lVar1 == 0) || ((lVar1 >> 0x28) + 7U < (ulong)(DAT_0220a4c0 + lVar8))) {
          iVar5 = (int)DAT_0220a4c0;
          u_00 = PatchEvalSimd::anon_class_24_3_bdfbcaa4::operator()
                           ((anon_class_24_3_bdfbcaa4 *)&valid1);
          uVar9 = (ulong)(uint)(iVar5 + (int)lVar8) << 0x28 |
                  u_00.ptr - SharedLazyTessellationCache::sharedLazyTessellationCache;
          if (u_00.ptr == 0) {
            uVar9 = 0;
          }
          LOCK();
          (entry->tag).data.super_atomic<long>.super___atomic_base<long>._M_i = uVar9;
          UNLOCK();
          (entry->mutex).flag.super_atomic<bool>._M_base._M_i = false;
LAB_005cac9b:
          if ((lVar3 + lVar8 + 7U < (ulong)(DAT_0220a4c0 + lVar8)) ||
             ((vfloat_impl<4> *)u_00.ptr == (vfloat_impl<4> *)0x0)) {
            valid1.field_0._0_8_ = mm_lookupmask_ps._0_8_;
            valid1.field_0._8_8_ = mm_lookupmask_ps._8_8_;
          }
          else {
            eval((PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
                  *)&valid1,(vboolf_impl<4> *)this,(Ref)valid0,(vfloat_impl<4> *)u_00.ptr,u,1.0,
                 (size_t)v);
          }
          plVar7 = (long *)*plVar6;
          if (plVar7 == (long *)0x0) {
            SharedLazyTessellationCache::getNextRenderThreadWorkState
                      ((SharedLazyTessellationCache *)
                       &SharedLazyTessellationCache::sharedLazyTessellationCache);
            plVar7 = (long *)*plVar6;
          }
          LOCK();
          *plVar7 = *plVar7 + -1;
          UNLOCK();
          valid2.field_0.i[0] = ~valid1.field_0.i[0] & (valid0->field_0).i[0];
          valid2.field_0.i[1] = ~valid1.field_0.i[1] & (valid0->field_0).i[1];
          valid2.field_0.i[2] = ~valid1.field_0.i[2] & (valid0->field_0).i[2];
          valid2.field_0.i[3] = ~valid1.field_0.i[3] & (valid0->field_0).i[3];
          auVar2._4_4_ = valid2.field_0.i[1];
          auVar2._0_4_ = valid2.field_0.i[0];
          auVar2._8_4_ = valid2.field_0.i[2];
          auVar2._12_4_ = valid2.field_0.i[3];
          iVar5 = movmskps((int)plVar7,auVar2);
          if (iVar5 != 0) {
            FeatureAdaptiveEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
            ::FeatureAdaptiveEvalSimd
                      (&local_70,edge_local,vertices_local,stride,&valid2,u,v,P,dPdu,dPdv,ddPdudu,
                       ddPdvdv,ddPdudv,dstride,N);
          }
          return;
        }
        (this_00->flag).super_atomic<bool>._M_base._M_i = false;
      }
    }
    LOCK();
    (t_state->counter).super___atomic_base<unsigned_long>._M_i =
         (t_state->counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
  } while( true );
}

Assistant:

PatchEvalSimd (SharedLazyTessellationCache::CacheEntry& entry, size_t commitCounter, 
                       const HalfEdge* edge, const char* vertices, size_t stride, const vbool& valid0, const vfloat& u, const vfloat& v, 
                       float* P, float* dPdu, float* dPdv, float* ddPdudu, float* ddPdvdv, float* ddPdudv, const size_t dstride, const size_t N)
        : P(P), dPdu(dPdu), dPdv(dPdv), ddPdudu(ddPdudu), ddPdvdv(ddPdvdv), ddPdudv(ddPdudv), dstride(dstride), N(N)
        {
          /* conservative time for the very first allocation */
          auto time = SharedLazyTessellationCache::sharedLazyTessellationCache.getTime(commitCounter);

          Ref patch = SharedLazyTessellationCache::lookup(entry,commitCounter,[&] () {
              auto alloc = [](size_t bytes) { return SharedLazyTessellationCache::malloc(bytes); };
              return Patch::create(alloc,edge,vertices,stride);
            }, true);

          auto curTime = SharedLazyTessellationCache::sharedLazyTessellationCache.getTime(commitCounter);
          const bool allAllocationsValid = SharedLazyTessellationCache::validTime(time,curTime);
          
          patch = allAllocationsValid ? patch : nullptr;

          /* use cached data structure for calculations */
          const vbool valid1 = patch ? eval(valid0,patch,u,v,1.0f,0) : vbool(false);
          SharedLazyTessellationCache::unlock();
          const vbool valid2 = valid0 & !valid1;
          if (any(valid2)) {
            FeatureAdaptiveEvalSimd<vbool,vint,vfloat,Vertex,Vertex_t>(edge,vertices,stride,valid2,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dstride,N);
          }
        }